

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::lts_20250127::Mutex::ReaderTryLockSlow(Mutex *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int ev;
  bool bVar4;
  
  iVar3 = -5;
  ev = 3;
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  do {
    if (iVar3 == 0) {
LAB_002656d3:
      PostSynchEvent(this,ev);
      return iVar3 != 0;
    }
    uVar2 = uVar1;
    if ((uVar1 & 0xc) == 0) {
      LOCK();
      uVar2 = (this->mu_).super___atomic_base<long>._M_i;
      bVar4 = uVar1 == uVar2;
      if (bVar4) {
        (this->mu_).super___atomic_base<long>._M_i = (uVar1 | 1) + 0x100;
        uVar2 = uVar1;
      }
      UNLOCK();
      if (bVar4) {
        DebugOnlyLockEnter(this);
        ev = 2;
        goto LAB_002656d3;
      }
    }
    iVar3 = iVar3 + 1;
    uVar1 = uVar2;
  } while( true );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool Mutex::ReaderTryLockSlow() {
  intptr_t v = mu_.load(std::memory_order_relaxed);
#if defined(__clang__)
#pragma nounroll
#endif
  for (int loop_limit = 5; loop_limit != 0; loop_limit--) {
    if ((v & kShared->slow_need_zero) == 0 &&
        mu_.compare_exchange_strong(v, (kMuReader | v) + kMuOne,
                                    std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      DebugOnlyLockEnter(this);
      PostSynchEvent(this, SYNCH_EV_READERTRYLOCK_SUCCESS);
      ABSL_TSAN_MUTEX_POST_LOCK(
          this, __tsan_mutex_read_lock | __tsan_mutex_try_lock, 0);
      return true;
    }
  }
  PostSynchEvent(this, SYNCH_EV_READERTRYLOCK_FAILED);
  ABSL_TSAN_MUTEX_POST_LOCK(this,
                            __tsan_mutex_read_lock | __tsan_mutex_try_lock |
                                __tsan_mutex_try_lock_failed,
                            0);
  return false;
}